

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_logit_bias_free(llama_sampler *smpl)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = smpl->ctx;
  if (pvVar1 != (void *)0x0) {
    pvVar2 = *(void **)((long)pvVar1 + 0x20);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)pvVar1 + 0x30) - (long)pvVar2);
    }
    pvVar2 = *(void **)((long)pvVar1 + 8);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)pvVar1 + 0x18) - (long)pvVar2);
    }
  }
  operator_delete(pvVar1,0x38);
  return;
}

Assistant:

static void llama_sampler_logit_bias_free(struct llama_sampler * smpl) {
    delete (llama_sampler_logit_bias *) smpl->ctx;
}